

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_reader.hpp
# Opt level: O3

ptrdiff_t __thiscall
pstore::http::
buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>_>
::pos(buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>_>
      *this,iterator *s)

{
  bool bVar1;
  int line;
  char *str;
  span<unsigned_char,__1L> *span;
  char *file;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_50;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_40;
  
  span = &this->span_;
  pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::span_iterator
            (&local_50,span,0);
  bVar1 = pstore::gsl::details::operator>(&local_50,s);
  line = 0x82;
  file = 
  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/http/buffered_reader.hpp"
  ;
  str = "s >= span_.begin () && s <= span_.end ()";
  if (!bVar1) {
    pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::span_iterator
              (&local_40,span,(span->storage_).super_extent_type<_1L>.size_);
    bVar1 = pstore::gsl::details::operator<=(s,&local_40);
    if (bVar1) {
      pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::
      span_iterator(&local_50,span,0);
      if (s->span_ == local_50.span_) {
        return s->index_ - local_50.index_;
      }
      line = 0xa2;
      file = 
      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/gsl.hpp"
      ;
      str = "span_ == rhs.span_";
    }
  }
  assert_failed(str,file,line);
}

Assistant:

std::ptrdiff_t pos (gsl::span<std::uint8_t>::iterator const & s) noexcept {
                PSTORE_ASSERT (s >= span_.begin () && s <= span_.end ());
                return s - span_.begin ();
            }